

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::SourceLocation>::emplaceRealloc<slang::SourceLocation_const&>
          (SmallVectorBase<slang::SourceLocation> *this,pointer pos,SourceLocation *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pSVar4;
  long lVar5;
  pointer pSVar6;
  iterator __result;
  SourceLocation *in_RDX;
  iterator in_RSI;
  SmallVectorBase<slang::SourceLocation> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  SourceLocation *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = max_size((SmallVectorBase<slang::SourceLocation> *)0x45a5ab);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  pSVar4 = begin(in_RDI);
  lVar5 = (long)__last - (long)pSVar4;
  pSVar6 = (pointer)operator_new(0x45a60a);
  pSVar6[lVar5 >> 3] = *in_RDX;
  pSVar4 = end(in_RDI);
  if (in_RSI == pSVar4) {
    __result = begin(in_RDI);
    pSVar4 = end(in_RDI);
    std::uninitialized_move<slang::SourceLocation*,slang::SourceLocation*>(in_RSI,__last,__result);
  }
  else {
    begin(in_RDI);
    std::uninitialized_move<slang::SourceLocation*,slang::SourceLocation*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    pSVar4 = end(in_RDI);
    std::uninitialized_move<slang::SourceLocation*,slang::SourceLocation*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  cleanup(in_RDI,(EVP_PKEY_CTX *)pSVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pSVar6;
  return pSVar6 + (lVar5 >> 3);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}